

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O2

void __thiscall QSystemTrayIconPrivate::addPlatformMenu(QSystemTrayIconPrivate *this,QMenu *menu)

{
  QAction *this_00;
  QAction **ppQVar1;
  QPlatformMenu *pQVar2;
  QMenu *pQVar3;
  QList<QAction_*> *__range1;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QMenu::platformMenu(menu);
  if (pQVar2 == (QPlatformMenu *)0x0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::actions((QList<QAction_*> *)&local_58,&menu->super_QWidget);
    ppQVar1 = local_58.ptr;
    lVar5 = local_58.size << 3;
    for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 8) {
      this_00 = *(QAction **)((long)ppQVar1 + lVar4);
      pQVar3 = QAction::menu<QMenu*>(this_00);
      if (pQVar3 != (QMenu *)0x0) {
        pQVar3 = QAction::menu<QMenu*>(this_00);
        addPlatformMenu(this,pQVar3);
      }
    }
    pQVar2 = (QPlatformMenu *)(**(code **)(*(long *)this->qpa_sys + 0xa8))();
    if (pQVar2 != (QPlatformMenu *)0x0) {
      QMenu::setPlatformMenu(menu,pQVar2);
    }
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconPrivate::addPlatformMenu(QMenu *menu) const
{
#if QT_CONFIG(menu)
    if (menu->platformMenu())
        return; // The platform menu already exists.

    // The recursion depth is the same as menu depth, so should not
    // be higher than 3 levels.
    const auto actions = menu->actions();
    for (QAction *action : actions) {
        if (action->menu())
            addPlatformMenu(action->menu());
    }

    // This menu should be processed *after* its children, otherwise
    // setMenu() is not called on respective QPlatformMenuItems.
    QPlatformMenu *platformMenu = qpa_sys->createMenu();
    if (platformMenu)
        menu->setPlatformMenu(platformMenu);
#else
    Q_UNUSED(menu);
#endif // QT_CONFIG(menu)
}